

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,wabt::interp::Simd<unsigned_int,(unsigned_char)4>,false>
          (Thread *this)

{
  Value VVar1;
  Value VVar2;
  Value value;
  
  VVar1 = Pop(this);
  VVar2 = Pop(this);
  value.field_0._0_8_ = (VVar1.field_0._8_8_ & 0xffffffff) * (VVar2.field_0._8_8_ & 0xffffffff);
  value.field_0._8_8_ = (VVar2.field_0._8_8_ >> 0x20) * (VVar1.field_0._8_8_ >> 0x20);
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}